

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

void __thiscall
peg::Sequence::
Sequence<std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
          (Sequence *this,shared_ptr<peg::Ope> *args,shared_ptr<peg::Ope> *args_1,
          shared_ptr<peg::Ope> *args_2,shared_ptr<peg::Ope> *args_3,shared_ptr<peg::Ope> *args_4)

{
  long lVar1;
  initializer_list<std::shared_ptr<peg::Ope>_> __l;
  undefined8 uStack_68;
  shared_ptr<peg::Ope> local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Sequence_00171c50;
  local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_50 = (args_1->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (args_1->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_40 = (args_2->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (args_2->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  local_30 = (args_3->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (args_3->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_20 = (args_4->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18 = (args_4->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  __l._M_len = 5;
  __l._M_array = &local_60;
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::vector
            (&this->opes_,__l,(allocator_type *)((long)&uStack_68 + 7));
  lVar1 = 0x50;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1));
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return;
}

Assistant:

Sequence(const Args &...args)
      : opes_{static_cast<std::shared_ptr<Ope>>(args)...} {}